

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<32U,_8U,_buffer_layout_bfs>::operator()
          (fill<32U,_8U,_buffer_layout_bfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  uchar *puVar1;
  uchar **ppuVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  uchar **ppuVar7;
  long lVar8;
  size_t __n;
  size_t sVar9;
  unsigned_long *puVar10;
  fill<32U,_16U,_buffer_layout_bfs> local_64;
  fill<32U,_17U,_buffer_layout_bfs> local_63;
  fill<32U,_17U,_buffer_layout_bfs> local_62;
  fill<32U,_16U,_buffer_layout_bfs> local_61;
  uchar **local_60;
  array<Stream,_32UL> *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  uchar **local_40;
  uchar **local_38;
  
  puVar6 = buffer_count->_M_elems + 0x10;
  local_48 = buffer_count->_M_elems + 0x11;
  local_38 = buffer + 0x61c;
  local_40 = buffer + 0x624;
  local_60 = buffer + 0x6c;
  sVar9 = 0;
  lVar8 = 0;
  local_58 = streams;
  local_50 = puVar6;
  do {
    uVar4 = *puVar6;
    if (uVar4 == 0) {
      fill<32U,_16U,_buffer_layout_bfs>::operator()(&local_61,local_58,buffer,buffer_count);
      puVar6 = local_48;
      uVar4 = buffer_count->_M_elems[0x10];
      if (uVar4 == 0) {
        uVar4 = *local_48;
        __n = -lVar8;
        lVar8 = -sVar9;
        break;
      }
    }
    puVar10 = local_48;
    uVar5 = *local_48;
    if (uVar5 == 0) {
      fill<32U,_17U,_buffer_layout_bfs>::operator()(&local_62,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x10];
      uVar5 = buffer_count->_M_elems[0x11];
      if (uVar5 == 0) {
        __n = -lVar8;
        lVar8 = -sVar9;
        puVar6 = local_50;
        goto LAB_00131a97;
      }
    }
    ppuVar7 = local_38 + -uVar4 + 8;
    ppuVar2 = local_40 + -uVar5 + 8;
    iVar3 = cmp(buffer[-uVar4 + 0x624],buffer[-uVar5 + 0x62c]);
    puVar6 = local_50;
    if (iVar3 < 1) {
      puVar10 = local_50;
      ppuVar2 = ppuVar7;
    }
    puVar1 = *ppuVar2;
    *puVar10 = *puVar10 - 1;
    buffer[sVar9 + 0x6c] = puVar1;
    check_input(local_60,sVar9);
    lVar8 = lVar8 + -8;
    sVar9 = sVar9 + 1;
    if (sVar9 == 0xb6) {
      buffer_count->_M_elems[8] = 0xb6;
      return;
    }
  } while( true );
  do {
    if (uVar4 == 0) {
      fill<32U,_17U,_buffer_layout_bfs>::operator()(&local_63,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x11];
      if (uVar4 == 0) goto LAB_00131b05;
    }
    *(uchar **)((long)buffer + __n + 0x360) = buffer[0x62c - uVar4];
    uVar4 = uVar4 - 1;
    *puVar6 = uVar4;
    lVar8 = lVar8 + -1;
    __n = __n + 8;
  } while (__n != 0x5b0);
  goto LAB_00131aec;
LAB_00131b05:
  ppuVar7 = (uchar **)((long)buffer + (0x910 - __n));
  sVar9 = -lVar8;
  memmove(buffer + lVar8 + 0x122,local_60,__n);
  buffer_count->_M_elems[8] = sVar9;
  goto LAB_00131b3a;
  while( true ) {
    *(uchar **)((long)buffer + __n + 0x360) = buffer[0x624 - uVar4];
    uVar4 = uVar4 - 1;
    *puVar6 = uVar4;
    lVar8 = lVar8 + -1;
    __n = __n + 8;
    if (__n == 0x5b0) break;
LAB_00131a97:
    if (uVar4 == 0) {
      fill<32U,_16U,_buffer_layout_bfs>::operator()(&local_64,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x10];
      puVar6 = local_50;
      if (uVar4 == 0) goto LAB_00131b05;
    }
  }
LAB_00131aec:
  buffer_count->_M_elems[8] = 0xb6;
  sVar9 = 0xb6;
  ppuVar7 = local_60;
LAB_00131b3a:
  check_input(ppuVar7,sVar9);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}